

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warm_cb.cc
# Opt level: O2

void accumu_var_adf(warm_cb *data,multi_learner *base,example *ec)

{
  action_score *paVar1;
  uint32_t uVar2;
  ulong uVar3;
  float fVar4;
  
  uVar2 = predict_sup_adf(data,base,ec);
  paVar1 = (data->a_s_adf)._begin;
  fVar4 = 0.0;
  for (uVar3 = 0; data->num_actions != uVar3; uVar3 = uVar3 + 1) {
    if (uVar2 == paVar1[uVar3].action + 1) {
      fVar4 = 1.0 / paVar1[uVar3].score;
    }
  }
  data->cumu_var = fVar4 + data->cumu_var;
  return;
}

Assistant:

void accumu_var_adf(warm_cb& data, multi_learner& base, example& ec)
{
	size_t pred_best_approx = predict_sup_adf(data, base, ec);
	float temp_var = 0.f;

	for (size_t a = 0; a < data.num_actions; ++a)
		if (pred_best_approx == data.a_s_adf[a].action + 1)
			temp_var = 1.0 / data.a_s_adf[a].score;

	data.cumu_var += temp_var;
}